

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O2

void pstore::serialize::serializer<pstore::indirect_string,void>::
     read_string_address<pstore::serialize::archive::database_reader&>
               (database_reader *archive,value_type *value)

{
  typed_address<pstore::address> addr;
  anon_union_8_2_d34ab9e4_for_indirect_string_3 aVar1;
  _Head_base<0UL,_const_pstore::address_*,_false> local_20;
  
  addr.a_.a_ = (address)archive->db_;
  database::getrou<pstore::address,void>((database *)&stack0xffffffffffffffd8,addr);
  aVar1 = (anon_union_8_2_d34ab9e4_for_indirect_string_3)(local_20._M_head_impl)->a_;
  value->db_ = (database *)addr.a_.a_;
  value->is_pointer_ = false;
  value->field_2 = aVar1;
  std::unique_ptr<const_pstore::address,_void_(*)(const_pstore::address_*)>::~unique_ptr
            ((unique_ptr<const_pstore::address,_void_(*)(const_pstore::address_*)> *)
             &stack0xffffffffffffffd8);
  return;
}

Assistant:

void serializer<indirect_string>::read_string_address (DBArchive && archive,
                                                               value_type & value) {
            database const & db = archive.get_db ();
            new (&value)
                value_type (db, *db.getrou (typed_address<address>::make (archive.get_address ())));
        }